

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O0

void __thiscall
S2RegionCoverer::ReplaceCellsWithAncestor
          (S2RegionCoverer *this,vector<S2CellId,_std::allocator<S2CellId>_> *covering,S2CellId id)

{
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> this_00;
  bool bVar1;
  iterator __first;
  iterator __last;
  ostream *poVar2;
  reference pSVar3;
  const_iterator local_a8;
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_a0;
  const_iterator local_98;
  byte local_79;
  S2LogMessage local_78;
  S2LogMessageVoidify local_61;
  S2CellId local_60;
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_58;
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_50;
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_48;
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> end;
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_28;
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> begin;
  vector<S2CellId,_std::allocator<S2CellId>_> *covering_local;
  S2RegionCoverer *this_local;
  S2CellId id_local;
  
  begin._M_current = (S2CellId *)covering;
  this_local = (S2RegionCoverer *)id.id_;
  __first = std::vector<S2CellId,_std::allocator<S2CellId>_>::begin(covering);
  __last = std::vector<S2CellId,_std::allocator<S2CellId>_>::end
                     ((vector<S2CellId,_std::allocator<S2CellId>_> *)begin._M_current);
  end._M_current = (S2CellId *)S2CellId::range_min((S2CellId *)&this_local);
  local_28 = std::
             lower_bound<__gnu_cxx::__normal_iterator<S2CellId*,std::vector<S2CellId,std::allocator<S2CellId>>>,S2CellId>
                       ((__normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                         )__first._M_current,
                        (__normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                         )__last._M_current,(S2CellId *)&end);
  local_50._M_current =
       (S2CellId *)
       std::vector<S2CellId,_std::allocator<S2CellId>_>::begin
                 ((vector<S2CellId,_std::allocator<S2CellId>_> *)begin._M_current);
  local_58._M_current =
       (S2CellId *)
       std::vector<S2CellId,_std::allocator<S2CellId>_>::end
                 ((vector<S2CellId,_std::allocator<S2CellId>_> *)begin._M_current);
  local_60 = S2CellId::range_max((S2CellId *)&this_local);
  local_48 = std::
             upper_bound<__gnu_cxx::__normal_iterator<S2CellId*,std::vector<S2CellId,std::allocator<S2CellId>>>,S2CellId>
                       (local_50,local_58,&local_60);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_48);
  local_79 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0x194,kFatal,(ostream *)&std::cerr);
    local_79 = 1;
    poVar2 = S2LogMessage::stream(&local_78);
    poVar2 = std::operator<<(poVar2,"Check failed: begin != end ");
    S2LogMessageVoidify::operator&(&local_61,poVar2);
  }
  this_00._M_current = begin._M_current;
  if ((local_79 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
  }
  local_a0 = __gnu_cxx::
             __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
             operator+(&local_28,1);
  __gnu_cxx::__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>>::
  __normal_iterator<S2CellId*>
            ((__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>> *)
             &local_98,&local_a0);
  __gnu_cxx::__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>>::
  __normal_iterator<S2CellId*>
            ((__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>> *)
             &local_a8,&local_48);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::erase
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)this_00._M_current,local_98,local_a8);
  pSVar3 = __gnu_cxx::
           __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
           operator*(&local_28);
  pSVar3->id_ = (uint64)this_local;
  return;
}

Assistant:

void S2RegionCoverer::ReplaceCellsWithAncestor(vector<S2CellId>* covering,
                                               S2CellId id) const {
  auto begin = std::lower_bound(covering->begin(), covering->end(),
                                id.range_min());
  auto end = std::upper_bound(covering->begin(), covering->end(),
                              id.range_max());
  S2_DCHECK(begin != end);
  covering->erase(begin + 1, end);
  *begin = id;
}